

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cpp
# Opt level: O0

void __thiscall Camera::_castShadowRays(Camera *this,Intersection *i,World *world)

{
  value_type v1;
  int iVar1;
  size_type sVar2;
  size_type sVar3;
  reference ppPVar4;
  reference ppSVar5;
  undefined4 extraout_var;
  float fVar6;
  double dVar7;
  ColorRGB CVar8;
  ColorRGB local_1f0 [2];
  undefined8 local_1d0;
  float local_1c8;
  undefined8 local_1b0;
  float local_1a8;
  ColorRGB local_180;
  ColorRGB local_170;
  undefined8 local_160;
  float local_158;
  undefined8 local_150;
  float local_148;
  ColorRGB local_144;
  ColorRGB local_138;
  undefined8 local_128;
  float local_120;
  ColorRGB local_118;
  undefined8 local_108;
  float local_100;
  ColorRGB local_f8;
  int local_ec;
  undefined1 local_e8 [4];
  int o;
  tvec3<float> local_dc;
  Ray local_d0;
  tvec3<float> local_a0;
  int local_94;
  byte local_8d;
  int l;
  float fStack_88;
  bool noHit;
  ColorRGB ackColor;
  float intensity;
  float r;
  SceneObject *obj;
  PointLight *pl;
  Ray shadowRay;
  vec3 lightDir;
  int numLights;
  int numObjects;
  World *world_local;
  Intersection *i_local;
  Camera *this_local;
  
  sVar2 = std::vector<SceneObject_*,_std::allocator<SceneObject_*>_>::size(world->sceneObjects);
  sVar3 = std::vector<PointLight_*,_std::allocator<PointLight_*>_>::size(world->pointLights);
  glm::detail::tvec3<float>::tvec3((tvec3<float> *)&shadowRay.tMax);
  Ray::Ray((Ray *)((long)&pl + 4));
  ColorRGB::ColorRGB((ColorRGB *)&l);
  local_94 = 0;
  do {
    if ((int)sVar3 <= local_94) {
      CVar8.b = ackColor.r;
      CVar8.r = (float)l;
      CVar8.g = fStack_88;
      ColorRGB::setColor(&i->color,CVar8);
      return;
    }
    ppPVar4 = std::vector<PointLight_*,_std::allocator<PointLight_*>_>::at
                        (world->pointLights,(long)local_94);
    v1 = *ppPVar4;
    glm::detail::operator-((detail *)&local_a0,&v1->position,&i->intersectionPoint);
    glm::detail::tvec3<float>::operator=((tvec3<float> *)&shadowRay.tMax,&local_a0);
    ackColor.b = glm::length<float>((tvec3<float> *)&shadowRay.tMax);
    glm::detail::tvec3<float>::tvec3(&local_dc,&i->intersectionPoint);
    glm::detail::tvec3<float>::tvec3((tvec3<float> *)local_e8,(tvec3<float> *)&shadowRay.tMax);
    Ray::Ray(&local_d0,&local_dc,(vec3 *)local_e8,0.1,ackColor.b);
    Ray::operator=((Ray *)((long)&pl + 4),&local_d0);
    local_8d = 1;
    for (local_ec = 0; local_ec < (int)sVar2; local_ec = local_ec + 1) {
      ppSVar5 = std::vector<SceneObject_*,_std::allocator<SceneObject_*>_>::at
                          (world->sceneObjects,(long)local_ec);
      iVar1 = (*(*ppSVar5)->_vptr_SceneObject[2])(*ppSVar5,(long)&pl + 4);
      if (CONCAT44(extraout_var,iVar1) != 0) {
        CVar8 = ColorRGB::operator*(&i->color,0.001);
        local_118.b = CVar8.b;
        local_100 = local_118.b;
        local_118._0_8_ = CVar8._0_8_;
        local_108._0_4_ = local_118.r;
        local_108._4_4_ = local_118.g;
        local_120 = local_118.b;
        local_128._0_4_ = local_118.r;
        local_128._4_4_ = local_118.g;
        local_118 = CVar8;
        CVar8 = ColorRGB::operator+((ColorRGB *)&l,CVar8);
        local_138._0_8_ = CVar8._0_8_;
        local_f8.r = local_138.r;
        local_f8.g = local_138.g;
        local_138.b = CVar8.b;
        local_f8.b = local_138.b;
        l = (int)local_138.r;
        fStack_88 = local_138.g;
        ackColor.r = local_138.b;
        local_8d = 0;
        local_138 = CVar8;
        break;
      }
    }
    if ((local_8d & 1) != 0) {
      fVar6 = glm::dot<float>(&i->surfaceNormal,
                              (tvec3<float> *)((long)&shadowRay.origin.field_0 + 4));
      dVar7 = log((double)ackColor.b * 0.5);
      ackColor.g = (float)((double)(fVar6 * 1.0) / dVar7);
      if (ackColor.g < 0.0) {
        ackColor.g = 0.0;
      }
      CVar8 = ColorRGB::operator*(&v1->color,ackColor.g);
      local_180.b = CVar8.b;
      local_170.b = local_180.b;
      local_180._0_8_ = CVar8._0_8_;
      local_170.r = local_180.r;
      local_170.g = local_180.g;
      CVar8 = ColorRGB::operator+(&local_170,world->ambientColor);
      local_1a8 = CVar8.b;
      local_158 = local_1a8;
      local_1b0 = CVar8._0_8_;
      local_160 = local_1b0;
      CVar8 = ColorRGB::operator*(&i->color,CVar8);
      local_1c8 = CVar8.b;
      local_148 = local_1c8;
      local_1d0 = CVar8._0_8_;
      local_150 = local_1d0;
      CVar8 = ColorRGB::operator+((ColorRGB *)&l,CVar8);
      local_1f0[0]._0_8_ = CVar8._0_8_;
      local_144.r = local_1f0[0].r;
      local_144.g = local_1f0[0].g;
      local_1f0[0].b = CVar8.b;
      local_144.b = local_1f0[0].b;
      l = (int)local_1f0[0].r;
      fStack_88 = local_1f0[0].g;
      ackColor.r = local_1f0[0].b;
    }
    local_94 = local_94 + 1;
  } while( true );
}

Assistant:

void Camera::_castShadowRays(Intersection *i, World *world) {
    
    int numObjects = world->sceneObjects->size();
    int numLights = world->pointLights->size();
    glm::vec3 lightDir;
    Ray shadowRay;
    PointLight *pl;
    SceneObject *obj;
    float r, intensity;
    ColorRGB ackColor = ColorRGB();
    bool noHit;
    
    for(int l = 0; l < numLights; ++l) {
        pl = world->pointLights->at(l);
        lightDir = pl->position - i->intersectionPoint;
        r = glm::length(lightDir);
        shadowRay = Ray(i->intersectionPoint, lightDir, 0.1, r);
        noHit = true;
        
        for(int o = 0; o < numObjects; ++o) {
            obj = world->sceneObjects->at(o);
            if( obj->intersects(shadowRay) ) {
                ackColor = ackColor + i->color * 0.001;
                noHit = false; break;
            }
        }

        if(noHit) {
			intensity = glm::dot(i->surfaceNormal, shadowRay.dir) * 1 / std::log(0.5*r);
			if(intensity < 0.0) intensity = 0.0;
			ackColor = ackColor + i->color * (pl->color * intensity + world->ambientColor);
        }
    }
    i->color.setColor(ackColor);
}